

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.c
# Opt level: O0

vecs_err_t fscan_count_hash(vecs_ctx_t *ctx,vecs_hash_t *testcase)

{
  int iVar1;
  ulong *in_RSI;
  undefined8 *in_RDI;
  int obtained_len;
  char string [10];
  uint count;
  undefined1 local_26 [10];
  uint local_1c;
  ulong *local_18;
  vecs_err_t local_4;
  
  local_1c = 1;
  local_18 = in_RSI;
  iVar1 = __isoc99_fscanf(*in_RDI," %s = %u ",local_26,&local_1c);
  if (iVar1 == 2) {
    iVar1 = memcmp(local_26,"Count",5);
    if (iVar1 == 0) {
      *local_18 = (ulong)(local_1c - 1);
      if (*local_18 < 0x401) {
        local_18[1] = (ulong)local_1c;
        local_4 = VECS_OK;
      }
      else {
        local_4 = VECS_FORMAT_TOO_LARGE_PLAINTEXT;
      }
    }
    else {
      local_4 = VECS_FORMAT_INCORRECT_COUNT_HDR;
    }
  }
  else {
    local_4 = VECS_FORMAT_INCORRECT_COUNT_HDR;
  }
  return local_4;
}

Assistant:

static vecs_err_t fscan_count_hash(vecs_ctx_t* const ctx,
                                   vecs_hash_t* const testcase)
{
    unsigned int count = 1;
    char string[10];
    const int obtained_len = fscanf(ctx->handle, " %s = %u ", string, &count);
    if (obtained_len != 2)
    {
        return VECS_FORMAT_INCORRECT_COUNT_HDR;
    }
    if (memcmp(string, "Count", 5) != 0)
    {
        return VECS_FORMAT_INCORRECT_COUNT_HDR;
    }
    testcase->message_len = count - 1;
    if (testcase->message_len > VECS_MAX_HASH_MESSAGE_LEN)
    {
        return VECS_FORMAT_TOO_LARGE_PLAINTEXT;
    }
    testcase->count = count;
    return VECS_OK;
}